

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qtlsbackend_openssl.cpp
# Opt level: O3

void __thiscall QTlsBackendOpenSSL::ensureCiphersAndCertsLoaded(QTlsBackendOpenSSL *this)

{
  long lVar1;
  QByteArray *pQVar2;
  char cVar3;
  QString *data;
  long lVar4;
  long lVar5;
  long in_FS_OFFSET;
  QDeadlineTimer QVar6;
  QByteArrayView QVar7;
  QDirListing dirList;
  QArrayData *d;
  QArrayDataPointer<QSslCertificate> local_90;
  undefined1 *local_78;
  QArrayDataPointer<QString> local_70;
  QArrayDataPointer<QByteArray> local_58;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  if (ensureCiphersAndCertsLoaded()::initMutex == '\0') {
    ensureCiphersAndCertsLoaded();
  }
  if ((QBasicAtomicInteger<int>)
      ensureCiphersAndCertsLoaded::initialized.super_QAtomicInteger<int>.
      super_QBasicAtomicInteger<int>._q_value.super___atomic_base<int>._M_i ==
      (QBasicAtomicInteger<int>)0x0) {
    QVar6.t2 = 0xffffffff;
    QVar6.type = 0x7fffffff;
    QVar6.t1 = (qint64)&ensureCiphersAndCertsLoaded::initMutex;
    QRecursiveMutex::tryLock(QVar6);
    if ((ensureCiphersAndCertsLoaded()::initializationStarted == '\0') &&
       ((QBasicAtomicInteger<int>)
        ensureCiphersAndCertsLoaded::initialized.super_QAtomicInteger<int>.
        super_QBasicAtomicInteger<int>._q_value.super___atomic_base<int>._M_i ==
        (QBasicAtomicInteger<int>)0x0)) {
      ensureCiphersAndCertsLoaded()::initializationStarted = '\x01';
      resetDefaultCiphers();
      QTlsBackend::resetDefaultEllipticCurves();
      local_58.size = (qsizetype)&DAT_aaaaaaaaaaaaaaaa;
      local_58.d = (Data *)&DAT_aaaaaaaaaaaaaaaa;
      local_58.ptr = (QByteArray *)&DAT_aaaaaaaaaaaaaaaa;
      QSslSocketPrivate::unixRootCertDirectories();
      local_70.d = (Data *)&DAT_aaaaaaaaaaaaaaaa;
      local_70.ptr = (QString *)QArrayData::allocate((QArrayData **)&local_70,0x18,0x10,1,KeepSize);
      pQVar2 = local_58.ptr;
      ((local_70.ptr)->d).d = (Data *)0x0;
      ((local_70.ptr)->d).ptr =
           L"[0-9a-f][0-9a-f][0-9a-f][0-9a-f][0-9a-f][0-9a-f][0-9a-f][0-9a-f].[0-9]";
      ((local_70.ptr)->d).size = 0x46;
      local_70.size = 1;
      if ((undefined1 *)local_58.size != (undefined1 *)0x0) {
        lVar1 = local_58.size * 0x18;
        lVar5 = 0;
        do {
          local_78 = &DAT_aaaaaaaaaaaaaaaa;
          QVar7.m_data = *(storage_type **)((long)&(pQVar2->d).size + lVar5);
          QVar7.m_size = (qsizetype)&local_90;
          QString::fromLatin1(QVar7);
          QDirListing::QDirListing((QDirListing *)&local_78,&local_90,&local_70,0x18);
          if (&(local_90.d)->super_QArrayData != (QArrayData *)0x0) {
            LOCK();
            ((local_90.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
                 ((local_90.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
            UNLOCK();
            if (((local_90.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
              QArrayData::deallocate(&(local_90.d)->super_QArrayData,2,0x10);
            }
          }
          lVar4 = QDirListing::begin();
          if (lVar4 != 0) {
            QSslSocketPrivate::setRootCertOnDemandLoadingSupported(true);
            QDirListing::~QDirListing((QDirListing *)&local_78);
            break;
          }
          QDirListing::~QDirListing((QDirListing *)&local_78);
          lVar5 = lVar5 + 0x18;
        } while (lVar1 != lVar5);
      }
      cVar3 = QSslSocketPrivate::rootCertOnDemandLoadingSupported();
      if (cVar3 == '\0') {
        QTlsPrivate::systemCaCertificates();
        QTlsBackend::setDefaultCaCertificates((QList *)&local_90);
        QArrayDataPointer<QSslCertificate>::~QArrayDataPointer(&local_90);
      }
      QArrayDataPointer<QString>::~QArrayDataPointer(&local_70);
      QArrayDataPointer<QByteArray>::~QArrayDataPointer(&local_58);
      ensureCiphersAndCertsLoaded::initialized.super_QAtomicInteger<int>.
      super_QBasicAtomicInteger<int>._q_value.super___atomic_base<int>._M_i =
           (QAtomicInteger<int>)(QBasicAtomicInteger<int>)0x1;
    }
    QRecursiveMutex::unlock();
  }
  if (*(long *)(in_FS_OFFSET + 0x28) != local_38) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

void QTlsBackendOpenSSL::ensureCiphersAndCertsLoaded() const
{
    Q_CONSTINIT static bool initializationStarted = false;
    Q_CONSTINIT static QAtomicInt initialized = Q_BASIC_ATOMIC_INITIALIZER(0);
    Q_CONSTINIT static QRecursiveMutex initMutex;

    if (initialized.loadAcquire())
        return;

    const QMutexLocker locker(&initMutex);

    if (initializationStarted || initialized.loadAcquire())
        return;

    // Indicate that the initialization has already started in the current
    // thread in case of recursive calls. The atomic variable cannot be used
    // for this because it is checked without holding the init mutex.
    initializationStarted = true;

    auto guard = qScopeGuard([] { initialized.storeRelease(1); });

    resetDefaultCiphers();
    resetDefaultEllipticCurves();

#if QT_CONFIG(library)
    //load symbols needed to receive certificates from system store
#if defined(Q_OS_QNX)
    QSslSocketPrivate::setRootCertOnDemandLoadingSupported(true);
#elif defined(Q_OS_UNIX) && !defined(Q_OS_DARWIN)
    // check whether we can enable on-demand root-cert loading (i.e. check whether the sym links are there)
    const QList<QByteArray> dirs = QSslSocketPrivate::unixRootCertDirectories();
    const QStringList symLinkFilter{
        u"[0-9a-f][0-9a-f][0-9a-f][0-9a-f][0-9a-f][0-9a-f][0-9a-f][0-9a-f].[0-9]"_s};
    for (const auto &dir : dirs) {
        QDirListing dirList(QString::fromLatin1(dir), symLinkFilter,
                            QDirListing::IteratorFlag::FilesOnly);
        if (dirList.cbegin() != dirList.cend()) { // Not empty
            QSslSocketPrivate::setRootCertOnDemandLoadingSupported(true);
            break;
        }
    }
#endif
#endif // QT_CONFIG(library)
    // if on-demand loading was not enabled, load the certs now
    if (!QSslSocketPrivate::rootCertOnDemandLoadingSupported())
        setDefaultCaCertificates(systemCaCertificates());
#ifdef Q_OS_WIN
    //Enabled for fetching additional root certs from windows update on windows.
    //This flag is set false by setDefaultCaCertificates() indicating the app uses
    //its own cert bundle rather than the system one.
    //Same logic that disables the unix on demand cert loading.
    //Unlike unix, we do preload the certificates from the cert store.
    QSslSocketPrivate::setRootCertOnDemandLoadingSupported(true);
#endif
}